

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

void uo_cb_destroy(uo_cb *cb)

{
  uo_cb_func_linklist *link;
  _Bool _Var1;
  uo_cb_linklist *link_00;
  uo_cb_func_linklist *cb_func_linklist;
  uo_cb *cb_local;
  
  uo_stack_destroy_at(&cb->stack);
  while( true ) {
    _Var1 = uo__linklist_is_empty(&cb->funclist);
    if (((_Var1 ^ 0xffU) & 1) == 0) break;
    link = (uo_cb_func_linklist *)(cb->funclist).next;
    uo__linklist_unlink((uo_linklist *)link);
    uo_cb_func_linkpool_return(link);
  }
  link_00 = uo_cb_get_linklist(cb);
  uo_cb_linkpool_return(link_00);
  return;
}

Assistant:

void uo_cb_destroy(
    uo_cb *cb)
{
    uo_stack_destroy_at(&cb->stack);

    while (!uo_linklist_is_empty(&cb->funclist))
    {
        uo_cb_func_linklist *cb_func_linklist = (uo_cb_func_linklist *)uo_linklist_next(&cb->funclist);
        uo_linklist_unlink(cb_func_linklist);
        uo_cb_func_linkpool_return(cb_func_linklist);
    }

    uo_cb_linkpool_return(uo_cb_get_linklist(cb));
}